

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,duckdb::interval_t,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  long lVar9;
  const_reference pvVar10;
  idx_t iVar11;
  idx_t iVar12;
  uint uVar13;
  idx_t iVar14;
  int *piVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  value_type rhs_offset_in_row;
  interval_t *lhs_data;
  idx_t entry_idx;
  uchar **rhs_locations;
  idx_t local_80;
  idx_t local_78;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar10 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar10;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = *no_match_count;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar2->sel_vector;
      local_80 = 0;
      iVar11 = 0;
      do {
        iVar12 = iVar11;
        if (psVar6 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar6[iVar11];
        }
        iVar14 = iVar12;
        if (psVar7 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar7[iVar12];
        }
        lVar8 = *(long *)(pdVar4 + iVar12 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) == 0) {
LAB_015db997:
          *no_match_count = local_78 + 1;
          no_match_sel->sel_vector[local_78] = (sel_t)iVar12;
          local_78 = local_78 + 1;
        }
        else {
          piVar15 = (int *)(pdVar3 + iVar14 * 0x10);
          lVar9 = *(long *)(lVar8 + vVar5);
          lVar8 = *(long *)(lVar8 + 8 + vVar5);
          if (((*piVar15 != (int)lVar9) || (piVar15[1] != (int)((ulong)lVar9 >> 0x20))) ||
             (*(long *)(piVar15 + 2) != lVar8)) {
            lVar16 = (long)piVar15[1] + *(long *)(piVar15 + 2) / 86400000000;
            lVar17 = (lVar9 >> 0x20) + lVar8 / 86400000000;
            if ((((long)*piVar15 + lVar16 / 0x1e != (long)(int)lVar9 + lVar17 / 0x1e) ||
                (lVar16 % 0x1e != lVar17 % 0x1e)) ||
               (*(long *)(piVar15 + 2) % 86400000000 != lVar8 % 86400000000)) goto LAB_015db997;
          }
          psVar6[local_80] = (sel_t)iVar12;
          local_80 = local_80 + 1;
        }
        iVar11 = iVar11 + 1;
        if (count == iVar11) {
          return local_80;
        }
      } while( true );
    }
  }
  else if (count != 0) {
    local_78 = *no_match_count;
    psVar6 = sel->sel_vector;
    psVar7 = pSVar2->sel_vector;
    puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    local_80 = 0;
    iVar11 = 0;
    do {
      iVar12 = iVar11;
      if (psVar6 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar6[iVar11];
      }
      iVar14 = iVar12;
      if (psVar7 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar7[iVar12];
      }
      if (puVar1 == (unsigned_long *)0x0) {
        bVar18 = false;
      }
      else {
        bVar18 = (puVar1[iVar14 >> 6] >> (iVar14 & 0x3f) & 1) == 0;
      }
      lVar8 = *(long *)(pdVar4 + iVar12 * 8);
      uVar13 = (uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7);
      if ((bVar18) || (uVar13 == 0)) {
        bVar18 = (bool)(bVar18 ^ uVar13 == 0);
LAB_015db7af:
        if (bVar18) goto LAB_015db7b3;
LAB_015db7dd:
        psVar6[local_80] = (sel_t)iVar12;
        local_80 = local_80 + 1;
      }
      else {
        piVar15 = (int *)(pdVar3 + iVar14 * 0x10);
        lVar9 = *(long *)(lVar8 + vVar5);
        lVar8 = *(long *)(lVar8 + 8 + vVar5);
        if (((*piVar15 == (int)lVar9) && (piVar15[1] == (int)((ulong)lVar9 >> 0x20))) &&
           (*(long *)(piVar15 + 2) == lVar8)) goto LAB_015db7dd;
        lVar16 = (long)piVar15[1] + *(long *)(piVar15 + 2) / 86400000000;
        lVar17 = (lVar9 >> 0x20) + lVar8 / 86400000000;
        if (((long)*piVar15 + lVar16 / 0x1e == (long)(int)lVar9 + lVar17 / 0x1e) &&
           (lVar16 % 0x1e == lVar17 % 0x1e)) {
          bVar18 = *(long *)(piVar15 + 2) % 86400000000 != lVar8 % 86400000000;
          goto LAB_015db7af;
        }
LAB_015db7b3:
        *no_match_count = local_78 + 1;
        no_match_sel->sel_vector[local_78] = (sel_t)iVar12;
        local_78 = local_78 + 1;
      }
      iVar11 = iVar11 + 1;
      if (count == iVar11) {
        return local_80;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}